

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs_unicode.c
# Opt level: O0

void PHYSFS_utf8ToUcs4(char *src,PHYSFS_uint32 *dst,PHYSFS_uint64 len)

{
  PHYSFS_uint32 local_24;
  ulong uStack_20;
  PHYSFS_uint32 cp;
  PHYSFS_uint64 len_local;
  PHYSFS_uint32 *dst_local;
  char *src_local;
  
  uStack_20 = len - 4;
  len_local = (PHYSFS_uint64)dst;
  dst_local = (PHYSFS_uint32 *)src;
  while ((3 < uStack_20 && (local_24 = __PHYSFS_utf8codepoint((char **)&dst_local), local_24 != 0)))
  {
    if (local_24 == 0xffffffff) {
      local_24 = 0x3f;
    }
    *(PHYSFS_uint32 *)len_local = local_24;
    uStack_20 = uStack_20 - 4;
    len_local = len_local + 4;
  }
  *(undefined4 *)len_local = 0;
  return;
}

Assistant:

void PHYSFS_utf8ToUcs4(const char *src, PHYSFS_uint32 *dst, PHYSFS_uint64 len)
{
    len -= sizeof (PHYSFS_uint32);   /* save room for null char. */
    while (len >= sizeof (PHYSFS_uint32))
    {
        PHYSFS_uint32 cp = __PHYSFS_utf8codepoint(&src);
        if (cp == 0)
            break;
        else if (cp == UNICODE_BOGUS_CHAR_VALUE)
            cp = UNICODE_BOGUS_CHAR_CODEPOINT;
        *(dst++) = cp;
        len -= sizeof (PHYSFS_uint32);
    } /* while */

    *dst = 0;
}